

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta.cc
# Opt level: O1

void __thiscall tchecker::ta::ta_t::next(ta_t *this)

{
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *in_RCX;
  outgoing_edges_value_t *in_RDX;
  const_state_sptr_t *in_RSI;
  state_status_t in_R8D;
  
  next((ta_t *)&this[-1]._transition_allocator.
                super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
                .
                super_transition_pool_allocator_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>
                ._vedge_cache,in_RSI,in_RDX,in_RCX,in_R8D);
  return;
}

Assistant:

void ta_t::next(tchecker::ta::const_state_sptr_t const & s, tchecker::ta::outgoing_edges_value_t const & out_edge,
                std::vector<sst_t> & v, tchecker::state_status_t mask)
{
  tchecker::ta::state_sptr_t nexts = _state_allocator.clone(*s);
  tchecker::ta::transition_sptr_t t = _transition_allocator.construct();
  tchecker::state_status_t status = tchecker::ta::next(*_system, *nexts, *t, out_edge);
  if (status & mask) {
    if (_sharing_type == tchecker::ts::SHARING) {
      share(nexts);
      share(t);
    }
    v.push_back(std::make_tuple(status, nexts, t));
  }
}